

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_extension.cpp
# Opt level: O2

void duckdb::ParquetScanFunction::ParquetScanSerialize(Serializer *serializer,undefined8 param_2)

{
  char cVar1;
  FunctionData *pFVar2;
  pointer pTVar3;
  MultiFileList *pMVar4;
  OpenFileInfo *file;
  element_type *__args;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  files;
  optional_ptr<duckdb::FunctionData,_true> bind_data_p_local;
  ParquetOptions local_1e0;
  ParquetOptionsSerialization serialization;
  MultiFileOptions local_c8;
  
  _bind_data_p_local = param_2;
  pFVar2 = optional_ptr<duckdb::FunctionData,_true>::operator->(&bind_data_p_local);
  pTVar3 = unique_ptr<duckdb::TableFunctionData,_std::default_delete<duckdb::TableFunctionData>,_true>
           ::operator->((unique_ptr<duckdb::TableFunctionData,_std::default_delete<duckdb::TableFunctionData>,_true>
                         *)(pFVar2 + 0x20));
  files.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  files.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  files.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pMVar4 = shared_ptr<duckdb::MultiFileList,_true>::operator->
                     ((shared_ptr<duckdb::MultiFileList,_true> *)(pFVar2 + 0x28));
  (**(code **)(*(long *)pMVar4 + 0x20))(&serialization,pMVar4);
  for (__args = (element_type *)serialization.parquet_options._0_8_;
      __args != serialization.parquet_options.encryption_config.internal.
                super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr; __args = (element_type *)&(__args->column_keys)._M_h._M_before_begin) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&files,
               &__args->footer_key);
  }
  std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>::~vector
            ((vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_> *)&serialization);
  Serializer::WriteProperty<duckdb::vector<std::__cxx11::string,true>>
            (serializer,100,"files",&files);
  Serializer::WriteProperty<duckdb::vector<duckdb::LogicalType,true>>
            (serializer,0x65,"types",(vector<duckdb::LogicalType,_true> *)(pFVar2 + 0x130));
  Serializer::WriteProperty<duckdb::vector<std::__cxx11::string,true>>
            (serializer,0x66,"names",
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              *)(pFVar2 + 0x148));
  ParquetOptions::ParquetOptions(&local_1e0,(ParquetOptions *)(pTVar3 + 0x38));
  MultiFileOptions::MultiFileOptions(&local_c8,(MultiFileOptions *)(pFVar2 + 0x98));
  ParquetOptionsSerialization::ParquetOptionsSerialization(&serialization,&local_1e0,&local_c8);
  MultiFileOptions::~MultiFileOptions(&local_c8);
  ParquetOptions::~ParquetOptions(&local_1e0);
  Serializer::WriteProperty<duckdb::ParquetOptionsSerialization>
            (serializer,0x67,"parquet_options",&serialization);
  cVar1 = duckdb::SerializationCompatibility::Compare((ulong)(serializer + 0x10));
  if (cVar1 != '\0') {
    Serializer::WriteProperty<duckdb::vector<std::__cxx11::string,true>>
              (serializer,0x68,"table_columns",
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)(pFVar2 + 0x198));
  }
  ParquetOptionsSerialization::~ParquetOptionsSerialization(&serialization);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&files.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  return;
}

Assistant:

static void ParquetScanSerialize(Serializer &serializer, const optional_ptr<FunctionData> bind_data_p,
	                                 const TableFunction &function) {
		auto &bind_data = bind_data_p->Cast<MultiFileBindData>();
		auto &parquet_data = bind_data.bind_data->Cast<ParquetReadBindData>();

		vector<string> files;
		for (auto &file : bind_data.file_list->GetAllFiles()) {
			files.emplace_back(file.path);
		}
		serializer.WriteProperty(100, "files", files);
		serializer.WriteProperty(101, "types", bind_data.types);
		serializer.WriteProperty(102, "names", bind_data.names);
		ParquetOptionsSerialization serialization(parquet_data.parquet_options, bind_data.file_options);
		serializer.WriteProperty(103, "parquet_options", serialization);
		if (serializer.ShouldSerialize(3)) {
			serializer.WriteProperty(104, "table_columns", bind_data.table_columns);
		}
	}